

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O0

QSize __thiscall
QPixmapStyle::lineEditSizeFromContents
          (QPixmapStyle *this,QStyleOption *option,QSize *contentsSize,QWidget *param_4)

{
  int iVar1;
  int iVar2;
  QStyle *pQVar3;
  QSize QVar4;
  undefined8 in_RSI;
  QPixmapStyleDescriptor *in_RDI;
  long in_FS_OFFSET;
  int h;
  int w;
  int border;
  QPixmapStyleDescriptor *desc;
  QPixmapStylePrivate *d;
  QStyle *this_00;
  QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *in_stack_ffffffffffffff68;
  QStyle local_40 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QPixmapStyle *)0x400d7e);
  this_00 = local_40;
  QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>::value
            (in_stack_ffffffffffffff68,(ControlDescriptor *)this_00);
  pQVar3 = QStyle::proxy(this_00);
  iVar1 = (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,5,in_RSI,0);
  iVar2 = QSize::width((QSize *)0x400df8);
  iVar2 = iVar2 + iVar1 * 2;
  iVar1 = QMargins::left((QMargins *)0x400e10);
  iVar1 = iVar2 + iVar1;
  QMargins::right((QMargins *)0x400e2a);
  QSize::height((QSize *)0x400e40);
  QMargins::top((QMargins *)0x400e58);
  QMargins::bottom((QMargins *)0x400e72);
  QVar4 = QPixmapStylePrivate::computeSize
                    ((QPixmapStylePrivate *)CONCAT44(iVar1,iVar2),in_RDI,
                     (int)((ulong)this_00 >> 0x20),(int)this_00);
  QPixmapStyleDescriptor::~QPixmapStyleDescriptor((QPixmapStyleDescriptor *)0x400ea4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QSize QPixmapStyle::lineEditSizeFromContents(const QStyleOption *option,
                                             const QSize &contentsSize, const QWidget *) const
{
    Q_D(const QPixmapStyle);

    const QPixmapStyleDescriptor &desc = d->descriptors.value(LE_Enabled);
    const int border = 2 * proxy()->pixelMetric(PM_DefaultFrameWidth, option);

    int w = contentsSize.width() + border + desc.margins.left() + desc.margins.right();
    int h = contentsSize.height() + border + desc.margins.top() + desc.margins.bottom();

    return d->computeSize(desc, w, h);
}